

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

iterator * __thiscall QTextBlock::iterator::operator--(iterator *this)

{
  int iVar1;
  uint uVar2;
  uint n;
  uint uVar3;
  uint uVar4;
  
  uVar2 = QFragmentMapData<QTextFragmentData>::previous(&(this->p->fragments).data,this->n);
  this->n = uVar2;
  uVar3 = this->b;
  if (uVar2 != uVar3) {
    iVar1 = (this->p->fragments).data.field_0.fragments[uVar2].format;
    uVar4 = uVar2;
    while ((n = uVar2, n != uVar3 &&
           ((this->p->fragments).data.field_0.fragments[n].format != iVar1))) {
      uVar2 = QFragmentMapData<QTextFragmentData>::previous(&(this->p->fragments).data,n);
      this->n = uVar2;
      uVar3 = this->b;
      uVar4 = n;
    }
    this->n = uVar4;
  }
  return this;
}

Assistant:

QTextBlock::iterator &QTextBlock::iterator::operator--()
{
    n = p->fragmentMap().previous(n);

    if (n == b)
        return *this;

    int formatIndex = p->fragmentMap().fragment(n)->format;
    int last = n;

    while (n != b && p->fragmentMap().fragment(n)->format != formatIndex) {
        last = n;
        n = p->fragmentMap().previous(n);
    }

    n = last;
    return *this;
}